

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O3

H265eDpbFrm * get_ref_pic(H265eDpbFrm *frame_list,RK_S32 poc)

{
  uint uVar1;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","get_ref_pic");
  }
  for (uVar1 = 0; ((frame_list->inited == 0 || (frame_list->poc != poc)) && (uVar1 < 0xf));
      uVar1 = uVar1 + 1) {
    frame_list = frame_list + 1;
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","leave\n","get_ref_pic");
  }
  return frame_list;
}

Assistant:

H265eDpbFrm* get_ref_pic(H265eDpbFrm *frame_list, RK_S32 poc)
{
    RK_S32 index = 0;
    H265eDpbFrm *frame = NULL;

    h265e_dbg_func("enter\n");
    for (index = 0; index < MAX_REFS; index++) {
        frame = &frame_list[index];
        if (frame->inited && frame->poc == poc) {
            break;
        }
    }
    h265e_dbg_func("leave\n");
    return frame;
}